

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall LLVMBC::ICmpInst::ICmpInst(ICmpInst *this,Predicate pred_,Value *LHS,Value *RHS)

{
  Value *local_48;
  Value *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  CmpInst::CmpInst(&this->super_CmpInst,ICmp,pred_,LHS,RHS);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  local_48 = LHS;
  local_40 = RHS;
  std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>::
  _M_range_initialize<LLVMBC::Value*const*>
            ((vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_38,
             &local_48);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::_M_move_assign
            (&(this->super_CmpInst).super_Instruction.operands,
             (vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_38);
  std::_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
  ~_Vector_base((_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)
                &local_38);
  return;
}

Assistant:

ICmpInst::ICmpInst(Predicate pred_, Value *LHS, Value *RHS)
    : CmpInst(ValueKind::ICmp, pred_, LHS, RHS)
{
	set_operands({ LHS, RHS });
}